

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall icu_63::TimeZoneFormat::checkAbuttingHoursAndMinutes(TimeZoneFormat *this)

{
  UVector *this_00;
  bool bVar1;
  int32_t iVar2;
  FieldType FVar3;
  GMTOffsetField *this_01;
  FieldType fieldType;
  GMTOffsetField *item;
  int32_t i;
  UVector *items;
  UBool afterH;
  int32_t type;
  TimeZoneFormat *this_local;
  
  this->fAbuttingOffsetHoursAndMinutes = '\0';
  items._4_4_ = 0;
  do {
    if (5 < items._4_4_) {
      return;
    }
    bVar1 = false;
    this_00 = this->fGMTOffsetPatternItems[items._4_4_];
    for (item._4_4_ = 0; iVar2 = UVector::size(this_00), item._4_4_ < iVar2;
        item._4_4_ = item._4_4_ + 1) {
      this_01 = (GMTOffsetField *)UVector::elementAt(this_00,item._4_4_);
      FVar3 = GMTOffsetField::getType(this_01);
      if (FVar3 == TEXT) {
        if (bVar1) break;
      }
      else {
        if (bVar1) {
          this->fAbuttingOffsetHoursAndMinutes = '\x01';
          break;
        }
        if (FVar3 == HOUR) {
          bVar1 = true;
        }
      }
    }
    if (this->fAbuttingOffsetHoursAndMinutes != '\0') {
      return;
    }
    items._4_4_ = items._4_4_ + 1;
  } while( true );
}

Assistant:

void
TimeZoneFormat::checkAbuttingHoursAndMinutes() {
    fAbuttingOffsetHoursAndMinutes= FALSE;
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        UBool afterH = FALSE;
        UVector *items = fGMTOffsetPatternItems[type];
        for (int32_t i = 0; i < items->size(); i++) {
            const GMTOffsetField* item = (GMTOffsetField*)items->elementAt(i);
            GMTOffsetField::FieldType fieldType = item->getType();
            if (fieldType != GMTOffsetField::TEXT) {
                if (afterH) {
                    fAbuttingOffsetHoursAndMinutes = TRUE;
                    break;
                } else if (fieldType == GMTOffsetField::HOUR) {
                    afterH = TRUE;
                }
            } else if (afterH) {
                break;
            }
        }
        if (fAbuttingOffsetHoursAndMinutes) {
            break;
        }
    }
}